

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.h
# Opt level: O2

InProcCodeGenAllocators * __thiscall
NativeCodeGenerator::EnsureForegroundAllocators
          (NativeCodeGenerator *this,PageAllocator *pageAllocator)

{
  InProcCodeGenAllocators *pIVar1;
  
  if (this->foregroundAllocators != (InProcCodeGenAllocators *)0x0) {
    return this->foregroundAllocators;
  }
  pIVar1 = CreateAllocators(this,pageAllocator);
  this->foregroundAllocators = pIVar1;
  return pIVar1;
}

Assistant:

InProcCodeGenAllocators *EnsureForegroundAllocators(PageAllocator * pageAllocator)
    {
        Assert(!JITManager::GetJITManager()->IsOOPJITEnabled());
        if (this->foregroundAllocators == nullptr)
        {
            this->foregroundAllocators = CreateAllocators(pageAllocator);

#if !TARGET_64 && _CONTROL_FLOW_GUARD
            if (this->scriptContext->webWorkerId != Js::Constants::NonWebWorkerContextId)
            {
                this->foregroundAllocators->canCreatePreReservedSegment = true;
            }
#endif
        }

        return this->foregroundAllocators;
    }